

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

BOOL __thiscall
Js::FunctionBody::GetBranchOffsetWithin
          (FunctionBody *this,uint start,uint end,StatementAdjustmentRecord *record)

{
  AuxStatementData *pAVar1;
  List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  Type *other;
  int index;
  int iVar8;
  StatementAdjustmentRecord local_40;
  StatementAdjustmentRecord item;
  
  item.m_byteCodeOffset = end;
  if (end <= start) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x13f,"(start < end)","start < end");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pAVar1 = (this->m_sourceInfo).m_auxStatementData.ptr;
  uVar5 = 0;
  if ((pAVar1 != (AuxStatementData *)0x0) &&
     (pLVar2 = (pAVar1->m_statementAdjustmentRecords).ptr,
     pLVar2 != (List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
                *)0x0)) {
    item._4_4_ = (pLVar2->
                 super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
                 ).count;
    index = 0;
    iVar8 = 0;
    if (0 < (int)item._4_4_) {
      iVar8 = item._4_4_;
    }
    for (; iVar8 != index; index = index + 1) {
      other = JsUtil::
              List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((((this->m_sourceInfo).m_auxStatementData.ptr)->m_statementAdjustmentRecords).
                     ptr,index);
      StatementAdjustmentRecord::StatementAdjustmentRecord(&local_40,other);
      uVar6 = StatementAdjustmentRecord::GetByteCodeOffset(&local_40);
      if (start < uVar6) {
        uVar6 = StatementAdjustmentRecord::GetByteCodeOffset(&local_40);
        if (uVar6 < item.m_byteCodeOffset) {
          record->m_adjustmentType = local_40.m_adjustmentType;
          record->m_byteCodeOffset = local_40.m_byteCodeOffset;
          break;
        }
      }
    }
    uVar5 = (uint)(index < (int)item._4_4_);
  }
  return uVar5;
}

Assistant:

BOOL
    FunctionBody::GetBranchOffsetWithin(uint start, uint end, StatementAdjustmentRecord* record)
    {
        Assert(start < end);

        if (!this->GetStatementAdjustmentRecords())
        {
            // No Offset
            return FALSE;
        }

        int count = this->GetStatementAdjustmentRecords()->Count();
        for (int i = 0; i < count; i++)
        {
            StatementAdjustmentRecord item = this->GetStatementAdjustmentRecords()->Item(i);
            if (item.GetByteCodeOffset() > start && item.GetByteCodeOffset() < end)
            {
                *record = item;
                return TRUE;
            }
        }

        // No offset found in the range.
        return FALSE;
    }